

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryManager.cpp
# Opt level: O0

void __thiscall MemoryManager::~MemoryManager(MemoryManager *this)

{
  void *pvVar1;
  long in_RDI;
  uint32_t j;
  uint32_t i;
  undefined4 local_10;
  undefined4 local_c;
  
  for (local_c = 0; local_c < 0x400; local_c = local_c + 1) {
    if (*(long *)(in_RDI + (ulong)local_c * 8) != 0) {
      for (local_10 = 0; local_10 < 0x400; local_10 = local_10 + 1) {
        if (*(long *)(*(long *)(in_RDI + (ulong)local_c * 8) + (ulong)local_10 * 8) != 0) {
          pvVar1 = *(void **)(*(long *)(in_RDI + (ulong)local_c * 8) + (ulong)local_10 * 8);
          if (pvVar1 != (void *)0x0) {
            operator_delete__(pvVar1);
          }
          *(undefined8 *)(*(long *)(in_RDI + (ulong)local_c * 8) + (ulong)local_10 * 8) = 0;
        }
      }
      pvVar1 = *(void **)(in_RDI + (ulong)local_c * 8);
      if (pvVar1 != (void *)0x0) {
        operator_delete__(pvVar1);
      }
      *(undefined8 *)(in_RDI + (ulong)local_c * 8) = 0;
    }
  }
  return;
}

Assistant:

MemoryManager::~MemoryManager() {
  for (uint32_t i = 0; i < 1024; ++i) {
    if (this->memory[i] != nullptr) {
      for (uint32_t j = 0; j < 1024; ++j) {
        if (this->memory[i][j] != nullptr) {
          delete[] this->memory[i][j];
          this->memory[i][j] = nullptr;
        }
      }
      delete[] this->memory[i];
      this->memory[i] = nullptr;
    }
  }
}